

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

size_t * __thiscall
andres::
BinaryViewExpressionScalarSecond<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
::shapeEnd(BinaryViewExpressionScalarSecond<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
           *this)

{
  View<int,_true,_std::allocator<unsigned_long>_> *this_00;
  runtime_error *this_01;
  
  this_00 = this->e_;
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
  if (this_00->data_ != (pointer)0x0) {
    return (this_00->geometry_).shape_ + (this_00->geometry_).dimension_;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Assertion failed.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::size_t* shapeEnd() const 
        { return e_.shapeEnd(); }